

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O1

void __thiscall
ipx::SplittedNormalMatrix::_Apply
          (SplittedNormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  Vector *x;
  size_t sVar1;
  int *piVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  Timer timer;
  Timer TStack_48;
  Vector *local_40;
  double *local_38;
  
  Timer::Timer(&TStack_48);
  x = &this->work_;
  sVar1 = (this->work_)._M_size;
  local_38 = rhs_dot_lhs;
  if (sVar1 == rhs->_M_size) {
    if (sVar1 == 0) goto LAB_003b6376;
    pdVar3 = (this->work_)._M_data;
    pdVar7 = rhs->_M_data;
  }
  else {
    pdVar3 = (this->work_)._M_data;
    if (pdVar3 != (double *)0x0) {
      operator_delete(pdVar3);
    }
    sVar1 = rhs->_M_size;
    (this->work_)._M_size = sVar1;
    pdVar3 = (double *)operator_new(sVar1 << 3);
    (this->work_)._M_data = pdVar3;
    pdVar7 = rhs->_M_data;
    if (pdVar7 == (double *)0x0) goto LAB_003b6376;
    sVar1 = x->_M_size;
  }
  memcpy(pdVar3,pdVar7,sVar1 << 3);
LAB_003b6376:
  local_40 = rhs;
  Timer::Reset(&TStack_48);
  BackwardSolve(&this->L_,&this->U_,x);
  dVar8 = Timer::Elapsed(&TStack_48);
  this->time_Bt_ = dVar8 + this->time_Bt_;
  if (lhs->_M_size != 0) {
    memset(lhs->_M_data,0,lhs->_M_size << 3);
  }
  Timer::Reset(&TStack_48);
  AddNormalProduct(&this->N_,(double *)0x0,x,lhs);
  dVar8 = Timer::Elapsed(&TStack_48);
  this->time_NNt_ = dVar8 + this->time_NNt_;
  Timer::Reset(&TStack_48);
  ForwardSolve(&this->L_,&this->U_,lhs);
  dVar8 = Timer::Elapsed(&TStack_48);
  pdVar3 = local_38;
  this->time_B_ = dVar8 + this->time_B_;
  if (0 < (long)lhs->_M_size) {
    pdVar4 = local_40->_M_data;
    pdVar7 = pdVar4 + lhs->_M_size;
    pdVar6 = lhs->_M_data;
    do {
      *pdVar6 = *pdVar4 + *pdVar6;
      pdVar6 = pdVar6 + 1;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 < pdVar7);
  }
  piVar5 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar2) {
    pdVar7 = lhs->_M_data;
    do {
      pdVar7[*piVar5] = 0.0;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar2);
  }
  if (local_38 != (double *)0x0) {
    dVar8 = Dot(local_40,lhs);
    *pdVar3 = dVar8;
  }
  return;
}

Assistant:

void SplittedNormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                                  double* rhs_dot_lhs) {
    assert(prepared_);
    Timer timer;

    // Compute work = inverse(B') * rhs.
    work_ = rhs;
    timer.Reset();
    BackwardSolve(L_, U_, work_);
    time_Bt_ += timer.Elapsed();

    // Compute lhs = N*N' * work.
    lhs = 0.0;
    timer.Reset();
    AddNormalProduct(N_, nullptr, work_, lhs);
    time_NNt_ += timer.Elapsed();

    // Compute lhs := inverse(B) * lhs.
    timer.Reset();
    ForwardSolve(L_, U_, lhs);
    time_B_ += timer.Elapsed();

    lhs += rhs;
    for (Int i : free_positions_)
        lhs[i] = 0.0;
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
}